

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_Plugin_RuntimeFeatures_Test::
TestBody(CommandLineInterfaceTest_Plugin_RuntimeFeatures_Test *this)

{
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar3;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar4;
  char *in_R9;
  string_view filename;
  string_view name;
  string_view src;
  string_view data;
  string_view contents;
  AssertHelper local_158;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertHelper local_120;
  string binary_request;
  string base64_output;
  string local_c8;
  CodeGeneratorRequest request;
  string plugin_path;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "\n                      edition = \"2023\";\n                      package foo;\n                      message Foo {\n                        int32 b = 1 [features.field_presence = IMPLICIT];\n                      }"
  ;
  contents._M_len = 0xd1;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&plugin_path,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/fake_plugin"
             ,(allocator<char> *)&request);
  request.super_Message.super_MessageLite =
       (MessageLite)
       absl::lts_20250127::NullSafeStringView
                 (
                 "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir foo.proto --plugin=prefix-gen-fake_plugin="
                 );
  base64_output._M_dataplus._M_p = (pointer)plugin_path._M_string_length;
  base64_output._M_string_length = (size_type)plugin_path._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_c8,(lts_20250127 *)&request,(AlphaNum *)&base64_output,
             (AlphaNum *)plugin_path._M_string_length);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  filename._M_str = "foo.proto.request";
  filename._M_len = 0x11;
  pcVar4 = "foo.proto.request";
  compiler::(anonymous_namespace)::CommandLineInterfaceTest::ReadFile_abi_cxx11_
            (&base64_output,this,filename);
  binary_request._M_dataplus._M_p = (pointer)&binary_request.field_2;
  binary_request._M_string_length = 0;
  binary_request.field_2._M_local_buf[0] = '\0';
  src._M_str = (char *)&binary_request;
  src._M_len = (size_t)base64_output._M_dataplus._M_p;
  gtest_ar_.success_ =
       absl::lts_20250127::Base64Unescape
                 ((lts_20250127 *)base64_output._M_string_length,src,(Nonnull<std::string_*>)pcVar4)
  ;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar_.success_) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    CodeGeneratorRequest::CodeGeneratorRequest(&request);
    data._M_str = binary_request._M_dataplus._M_p;
    data._M_len = binary_request._M_string_length;
    bVar1 = MessageLite::ParseFromString((MessageLite *)&request,data);
    this_00 = &gtest_ar__1.message_;
    gtest_ar__1.success_ = bVar1;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (bVar1) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_00);
      gtest_ar__1._0_8_ = anon_var_dwarf_174438b;
      pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                         (&request.field_0._impl_.proto_file_.super_RepeatedPtrFieldBase,0);
      pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(pVVar2->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,0);
      protobuf::internal::RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                (&(pVVar3->field_0)._impl_.field_.super_RepeatedPtrFieldBase,0);
      testing::internal::
      PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
                (&gtest_ar_,&gtest_ar__1.success_,
                 (FeatureSet *)"request.proto_file(0).message_type(0).field(0).options().features()"
                );
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar4 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x6e3,pcVar4);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar__1._0_8_ = anon_var_dwarf_174438b;
      pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                         (&request.field_0._impl_.source_file_descriptors_.
                           super_RepeatedPtrFieldBase,0);
      pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(pVVar2->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,0);
      protobuf::internal::RepeatedPtrFieldBase::
      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                (&(pVVar3->field_0)._impl_.field_.super_RepeatedPtrFieldBase,0);
      testing::internal::
      PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
                (&gtest_ar_,&gtest_ar__1.success_,
                 (FeatureSet *)
                 "request.source_file_descriptors(0) .message_type(0) .field(0) .options() .features()"
                );
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar4 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x6e9,pcVar4);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        if (gtest_ar__1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
        }
      }
      this_00 = &gtest_ar_.message_;
    }
    else {
      testing::Message::Message((Message *)&local_158);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                 (AssertionResult *)"request.ParseFromString(binary_request)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x6df,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
      testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_158);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (local_158.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_158.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    CodeGeneratorRequest::~CodeGeneratorRequest(&request);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&request,(internal *)&gtest_ar_,
               (AssertionResult *)"absl::Base64Unescape(base64_output, &binary_request)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x6dd,(char *)request.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&request);
    if (gtest_ar__1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  std::__cxx11::string::~string((string *)&binary_request);
  std::__cxx11::string::~string((string *)&base64_output);
  std::__cxx11::string::~string((string *)&plugin_path);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_RuntimeFeatures) {
  CreateTempFile("foo.proto",
                 R"schema(
                      edition = "2023";
                      package foo;
                      message Foo {
                        int32 b = 1 [features.field_presence = IMPLICIT];
                      })schema");

#ifdef GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH
  std::string plugin_path = GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH;
#else
  std::string plugin_path = absl::StrCat(
      TestUtil::TestSourceDir(), "/google/protobuf/compiler/fake_plugin");
#endif

  // Invoke protoc with fake_plugin to get ahold of the CodeGeneratorRequest
  // sent by protoc.
  Run(absl::StrCat(
      "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir "
      "foo.proto --plugin=prefix-gen-fake_plugin=",
      plugin_path));
  ExpectNoErrors();
  std::string base64_output = ReadFile("foo.proto.request");
  std::string binary_request;
  ASSERT_TRUE(absl::Base64Unescape(base64_output, &binary_request));
  CodeGeneratorRequest request;
  ASSERT_TRUE(request.ParseFromString(binary_request));

  EXPECT_THAT(
      request.proto_file(0).message_type(0).field(0).options().features(),
      EqualsProto(R"pb(field_presence: IMPLICIT)pb"));
  EXPECT_THAT(request.source_file_descriptors(0)
                  .message_type(0)
                  .field(0)
                  .options()
                  .features(),
              EqualsProto(R"pb(field_presence: IMPLICIT)pb"));
}